

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# mpx_helper.c
# Opt level: O1

uint64_t helper_bndldx32_x86_64(CPUX86State *env,target_ulong base,target_ulong ptr)

{
  uint32_t uVar1;
  uint32_t uVar2;
  uint32_t uVar3;
  uint64_t uVar4;
  uintptr_t unaff_retaddr;
  
  uVar1 = lookup_bte32(env,(uint32_t)base,unaff_retaddr);
  uVar2 = cpu_ldl_data_ra_x86_64(env,(ulong)uVar1,unaff_retaddr);
  uVar3 = cpu_ldl_data_ra_x86_64(env,(ulong)(uVar1 + 4),unaff_retaddr);
  uVar1 = cpu_ldl_data_ra_x86_64(env,(ulong)(uVar1 + 8),unaff_retaddr);
  uVar4 = 0;
  if (uVar1 == ptr) {
    uVar4 = CONCAT44(uVar3,uVar2);
  }
  return uVar4;
}

Assistant:

uint64_t helper_bndldx32(CPUX86State *env, target_ulong base, target_ulong ptr)
{
    uintptr_t ra = GETPC();
    uint32_t bte, lb, ub, pt;

    bte = lookup_bte32(env, base, ra);
    lb = cpu_ldl_data_ra(env, bte, ra);
    ub = cpu_ldl_data_ra(env, bte + 4, ra);
    pt = cpu_ldl_data_ra(env, bte + 8, ra);

    if (pt != ptr) {
        lb = ub = 0;
    }
    return ((uint64_t)ub << 32) | lb;
}